

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

dxil_spv_result
dxil_spv_parsed_blob_scan_resources
          (dxil_spv_parsed_blob blob,dxil_spv_srv_remapper_cb srv_remapper,
          dxil_spv_sampler_remapper_cb sampler_remapper,dxil_spv_cbv_remapper_cb cbv_remapper,
          dxil_spv_uav_remapper_cb uav_remapper,void *userdata)

{
  Remapper remapper;
  ResourceRemappingInterface local_c0;
  dxil_spv_srv_remapper_cb local_b8;
  void *local_b0;
  dxil_spv_sampler_remapper_cb local_a8;
  void *local_a0;
  dxil_spv_uav_remapper_cb local_98;
  void *local_90;
  dxil_spv_cbv_remapper_cb local_88;
  void *local_80;
  
  local_c0._vptr_ResourceRemappingInterface =
       (_func_int **)&PTR__ResourceRemappingInterface_001f8140;
  memset(&local_b8,0,0x88);
  local_b8 = srv_remapper;
  local_b0 = userdata;
  local_a8 = sampler_remapper;
  local_a0 = userdata;
  local_98 = uav_remapper;
  local_90 = userdata;
  local_88 = cbv_remapper;
  local_80 = userdata;
  dxil_spv::Converter::scan_resources(&local_c0,&blob->bc);
  return DXIL_SPV_SUCCESS;
}

Assistant:

dxil_spv_result dxil_spv_parsed_blob_scan_resources(dxil_spv_parsed_blob blob,
                                                    dxil_spv_srv_remapper_cb srv_remapper,
                                                    dxil_spv_sampler_remapper_cb sampler_remapper,
                                                    dxil_spv_cbv_remapper_cb cbv_remapper,
                                                    dxil_spv_uav_remapper_cb uav_remapper, void *userdata)
{
	Remapper remapper;
	remapper.srv_remapper = srv_remapper;
	remapper.srv_userdata = userdata;
	remapper.sampler_remapper = sampler_remapper;
	remapper.sampler_userdata = userdata;
	remapper.cbv_remapper = cbv_remapper;
	remapper.cbv_userdata = userdata;
	remapper.uav_remapper = uav_remapper;
	remapper.uav_userdata = userdata;

	Converter::scan_resources(&remapper, blob->bc);
	return DXIL_SPV_SUCCESS;
}